

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subtract.hpp
# Opt level: O2

int duckdb::DecimalSubtractOverflowCheck::Operation<int,int,int>(int left,int right)

{
  OutOfRangeException *this;
  allocator local_41;
  string local_40;
  
  if (right < 0) {
    if (right + 999999999 < left) goto LAB_014decb7;
  }
  else if (left < right + -999999999) {
LAB_014decb7:
    this = (OutOfRangeException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&local_40,
               "Overflow in subtract of DECIMAL(18) (%d - %d). You might want to add an explicit cast to a bigger decimal."
               ,&local_41);
    OutOfRangeException::OutOfRangeException<int,int>(this,&local_40,left,right);
    __cxa_throw(this,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
  }
  return left - right;
}

Assistant:

static inline TR Operation(TA left, TB right) {
		TR result;
		if (!TryDecimalSubtract::Operation<TA, TB, TR>(left, right, result)) {
			throw OutOfRangeException("Overflow in subtract of DECIMAL(18) (%d - %d). You might want to add an "
			                          "explicit cast to a bigger decimal.",
			                          left, right);
		}
		return result;
	}